

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  uint uVar6;
  ATTRIBUTE *pAVar8;
  char **ppcVar9;
  byte *pbVar10;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar11;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  byte *pbVar12;
  char **ppcStack_50;
  int tok;
  uint uVar7;
  
  pAVar8 = (ATTRIBUTE *)(end + -(long)ptr);
  if ((long)pAVar8 < 1) {
    return -1;
  }
  cVar1 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  ppcStack_50 = (char **)&DAT_00000001;
  if (cVar1 == '\x05') {
    if (pAVar8 == (ATTRIBUTE *)&DAT_00000001) {
      return -2;
    }
    iVar3 = (*enc[3].nameLength)(enc,ptr);
    if ((iVar3 != 0) ||
       (iVar3 = (*enc[3].literalScanners[0])(enc,ptr,extraout_RDX_01,&pAVar8->name), iVar3 == 0))
    goto LAB_004e5f56;
    ppcStack_50 = (char **)0x2;
  }
  else {
    if (cVar1 == '\x06') {
      if (pAVar8 < (ATTRIBUTE *)0x3) {
        return -2;
      }
      pcVar4 = (*enc[3].skipS)(enc,ptr);
      if ((int)pcVar4 != 0) goto LAB_004e5f56;
      iVar3 = (*enc[3].literalScanners[1])(enc,ptr,extraout_RDX_00,&pAVar8->name);
      ppcStack_50 = (char **)0x3;
    }
    else {
      if (cVar1 != '\a') {
        if ((cVar1 == '\x16') || (cVar1 == '\x18')) goto LAB_004e5fef;
        goto LAB_004e5f56;
      }
      if (pAVar8 < (ATTRIBUTE *)0x4) {
        return -2;
      }
      iVar3 = (*enc[3].getAtts)(enc,ptr,-2,pAVar8);
      if (iVar3 != 0) goto LAB_004e5f56;
      iVar3 = (*enc[3].nameMatchesAscii)(enc,ptr,extraout_RDX,(char *)pAVar8);
      ppcStack_50 = (char **)0x4;
    }
    if (iVar3 == 0) {
LAB_004e5f56:
      *nextTokPtr = ptr;
      return 0;
    }
  }
LAB_004e5fef:
  pbVar12 = (byte *)((long)ppcStack_50 + (long)ptr);
  do {
    uVar5 = (long)end - (long)pbVar12;
    if ((long)uVar5 < 1) {
      return -1;
    }
    uVar7 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar12);
    uVar6 = uVar7 - 5;
    if (0x18 < uVar6) {
switchD_004e6030_caseD_8:
      pbVar10 = pbVar12;
LAB_004e61d3:
      *nextTokPtr = (char *)pbVar10;
      return 0;
    }
    ppcStack_50 = (char **)&DAT_00000001;
    switch(uVar7) {
    case 5:
      if (uVar5 == 1) {
        return -2;
      }
      ppcVar9 = (char **)&DAT_00000001;
      iVar3 = (*enc[3].nameLength)(enc,(char *)pbVar12);
      if (iVar3 != 0) goto switchD_004e6030_caseD_1d;
      iVar3 = (*enc[3].scanners[0])(enc,(char *)pbVar12,extraout_RDX_02,ppcVar9);
      ppcStack_50 = (char **)0x2;
      break;
    case 6:
      if (uVar5 < 3) {
        return -2;
      }
      ppcVar9 = (char **)&DAT_00000001;
      pcVar4 = (*enc[3].skipS)(enc,(char *)pbVar12);
      if ((int)pcVar4 != 0) goto switchD_004e6030_caseD_1d;
      iVar3 = (*enc[3].scanners[1])(enc,(char *)pbVar12,extraout_RDX_04,ppcVar9);
      ppcStack_50 = (char **)0x3;
      break;
    case 7:
      if (uVar5 < 4) {
        return -2;
      }
      ppcVar9 = (char **)&DAT_00000001;
      iVar3 = (*enc[3].getAtts)(enc,(char *)pbVar12,
                                (&switchD_004e6030::switchdataD_006774ec)[uVar6] + 0x6774ec,
                                (ATTRIBUTE *)&DAT_00000001);
      if (iVar3 != 0) goto switchD_004e6030_caseD_1d;
      iVar3 = (*enc[3].scanners[2])(enc,(char *)pbVar12,extraout_RDX_03,ppcVar9);
      ppcStack_50 = (char **)0x4;
      break;
    default:
      goto switchD_004e6030_caseD_8;
    case 9:
    case 10:
    case 0x15:
      iVar3 = normal_checkPiTarget
                        ((ENCODING *)ptr,(char *)pbVar12,(char *)&tok,(int *)&DAT_00000001);
      if (iVar3 == 0) goto switchD_004e6030_caseD_1d;
      uVar11 = extraout_RDX_05;
      pbVar12 = pbVar12 + 1;
      goto LAB_004e60f9;
    case 0xf:
      iVar3 = normal_checkPiTarget
                        ((ENCODING *)ptr,(char *)pbVar12,(char *)&tok,(int *)&DAT_00000001);
      if (iVar3 == 0) goto switchD_004e6030_caseD_1d;
      pbVar10 = pbVar12 + 1;
      if ((byte *)end == pbVar10 || (long)end - (long)pbVar10 < 0) {
        return -1;
      }
      if (*pbVar10 == 0x3e) {
        *nextTokPtr = (char *)(pbVar12 + 2);
        return tok;
      }
      goto LAB_004e61d3;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_004e6030_caseD_16;
    case 0x1d:
      goto switchD_004e6030_caseD_1d;
    }
    if (iVar3 == 0) {
switchD_004e6030_caseD_1d:
      *nextTokPtr = (char *)pbVar12;
      return 0;
    }
switchD_004e6030_caseD_16:
    pbVar12 = pbVar12 + (long)ppcStack_50;
  } while( true );
switchD_004e6125_caseD_f:
  pbVar12 = pbVar10 + 1;
  if ((byte *)end == pbVar12 || (long)end - (long)pbVar12 < 0) {
    return -1;
  }
  if (*pbVar12 == 0x3e) {
    *nextTokPtr = (char *)(pbVar10 + 2);
    return tok;
  }
LAB_004e60f9:
  pbVar10 = pbVar12;
  uVar5 = (long)end - (long)pbVar10;
  if ((long)uVar5 < 1) {
    return -1;
  }
  bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar10);
  if (0xf < (ulong)bVar2) {
switchD_004e6125_caseD_2:
    pbVar12 = pbVar10 + 1;
    goto LAB_004e60f9;
  }
  switch(bVar2) {
  case 0:
  case 1:
  case 8:
    break;
  default:
    goto switchD_004e6125_caseD_2;
  case 5:
    if (uVar5 == 1) {
      return -2;
    }
    iVar3 = (*enc[3].nameLength)(enc,(char *)pbVar10);
    if (iVar3 == 0) {
      uVar11 = extraout_RDX_06;
      pbVar12 = pbVar10 + 2;
      goto LAB_004e60f9;
    }
    break;
  case 6:
    if (uVar5 < 3) {
      return -2;
    }
    pcVar4 = (*enc[3].skipS)(enc,(char *)pbVar10);
    if ((int)pcVar4 == 0) {
      uVar11 = extraout_RDX_07;
      pbVar12 = pbVar10 + 3;
      goto LAB_004e60f9;
    }
    break;
  case 7:
    if (uVar5 < 4) {
      return -2;
    }
    iVar3 = (*enc[3].getAtts)(enc,(char *)pbVar10,(int)uVar11,
                              (ATTRIBUTE *)
                              ((long)&switchD_004e6125::switchdataD_00677550 +
                              (long)(int)(&switchD_004e6125::switchdataD_00677550)[bVar2]));
    if (iVar3 == 0) {
      uVar11 = extraout_RDX_08;
      pbVar12 = pbVar10 + 4;
      goto LAB_004e60f9;
    }
    break;
  case 0xf:
    goto switchD_004e6125_caseD_f;
  }
  *nextTokPtr = (char *)pbVar10;
  return 0;
}

Assistant:

static int PTRCALL
PREFIX(scanPi)(const ENCODING *enc, const char *ptr, const char *end,
               const char **nextTokPtr) {
  int tok;
  const char *target = ptr;
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S:
    case BT_CR:
    case BT_LF:
      if (! PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (HAS_CHAR(enc, ptr, end)) {
        switch (BYTE_TYPE(enc, ptr)) {
          INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (! PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}